

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O2

void sysbvm_sourceCode_computeLineAndColumnForIndex
               (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t index,
               uint32_t *outLine,uint32_t *outColumn)

{
  sysbvm_tuple_t orderedCollection;
  ulong uVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar1 = *(ulong *)(sourceCode + 0x40);
  if (uVar1 == 0) {
    orderedCollection = sysbvm_orderedCollection_create(context);
    uVar1 = *(ulong *)(sourceCode + 0x10);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar2 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar2 = 0;
    }
    sysbvm_orderedCollection_add(context,orderedCollection,9);
    uVar8 = 0x10;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (*(char *)(uVar1 + 0x10 + uVar3) == '\n') {
        sysbvm_orderedCollection_add(context,orderedCollection,uVar8 & 0xffffffff0 | 9);
      }
      uVar8 = uVar8 + 0x10;
    }
    uVar1 = sysbvm_orderedCollection_asArray(context,orderedCollection);
    *(ulong *)(sourceCode + 0x40) = uVar1;
  }
  bVar10 = (uVar1 & 0xf) != 0;
  if (bVar10 || uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (index == 0 || (index & 0xf) != 0) {
    uVar9 = (uint)(index >> 4);
  }
  else {
    uVar9 = *(uint *)(index + 0x10);
  }
  uVar4 = 0;
  uVar8 = 0;
  uVar3 = 0;
  while (uVar5 = uVar2, uVar8 <= uVar5 && uVar5 - uVar8 != 0) {
    uVar6 = (uVar5 - uVar8 >> 1) + uVar8;
    if (bVar10 || uVar1 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(uVar1 + 0x10 + uVar6 * 8);
    }
    if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
      uVar7 = uVar7 >> 4;
    }
    else {
      uVar7 = (ulong)*(uint *)(uVar7 + 0x10);
    }
    uVar2 = uVar6;
    if ((uint)uVar7 <= uVar9) {
      uVar8 = uVar6 + 1;
      uVar4 = uVar7 & 0xffffffff;
      uVar2 = uVar5;
      uVar3 = uVar6;
    }
  }
  if (outLine != (uint32_t *)0x0) {
    *outLine = (int)uVar3 + 1;
  }
  if (outColumn != (uint32_t *)0x0) {
    *outColumn = (uVar9 - (int)uVar4) + 1;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_sourceCode_computeLineAndColumnForIndex(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t index, uint32_t *outLine, uint32_t *outColumn)
{
    // Make sure the line start index table is built.
    sysbvm_tuple_t indexTable = sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt(context, sourceCode);

    // Perform a binary search.
    size_t indexTableSize = sysbvm_array_getSize(indexTable);
    size_t indexValue = sysbvm_tuple_uint32_decode(index);

    size_t left = 0;
    size_t right = indexTableSize;
    size_t bestSoFar = 0;
    size_t bestIndexSoFar = 0;
    while(left < right)
    {
        size_t middle = left + (right - left) / 2;
        size_t middleIndex = sysbvm_tuple_uint32_decode(sysbvm_array_at(indexTable, middle));
        if(middleIndex <= indexValue)
        {
            bestSoFar = middle;
            bestIndexSoFar = middleIndex;
            left = middle + 1;
        }
        else if(middleIndex > indexValue)
        {
            right = middle;
        }
    }

    size_t line = bestSoFar + 1;
    size_t column = indexValue - bestIndexSoFar + 1;

    // Emit the result.
    if(outLine)
        *outLine = line;
    if(outColumn)
        *outColumn = column;
}